

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O3

MemChunk * __thiscall
cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::arenaAlloc
          (MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void> *this,size_type chunkSize)

{
  size_type *psVar1;
  SmallMemChunk *chunk;
  FixedArena *pFVar2;
  MemSegment *pMVar3;
  MemSegment *pMVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  SmallMemChunk *curr;
  SmallMemChunk *pSVar8;
  SmallMemChunk *pSVar9;
  CircularList<cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
  *pCVar10;
  
  if (((chunkSize < 0xffffffffffffffe8) &&
      (((this->m_footprintLimit == 0 ||
        (uVar7 = this->m_footprint + chunkSize + 0x18,
        uVar7 <= this->m_footprintLimit && this->m_footprint < uVar7)) &&
       (pFVar2 = this->m_arena, pFVar2->m_used == false)))) &&
     (uVar7 = pFVar2->m_size, chunkSize + 0x18 <= uVar7)) {
    pFVar2->m_used = true;
    pMVar3 = (MemSegment *)pFVar2->m_page;
    if (pMVar3 != (MemSegment *)0x0) {
      uVar5 = this->m_footprint + uVar7;
      this->m_footprint = uVar5;
      if (this->m_maxFootprint < uVar5) {
        this->m_maxFootprint = uVar5;
      }
      pMVar3->m_size = uVar7;
      pMVar3->m_pad = 1;
      uVar5 = uVar7 - 0x18;
      pMVar3[1].m_size = uVar5;
      *(ulong *)((long)pMVar3 + (uVar7 - 8)) = uVar5;
      pMVar4 = this->m_segList;
      if (pMVar4 == (MemSegment *)0x0) {
        this->m_release_checks = 0xfff;
      }
      psVar1 = &pMVar3->m_pad;
      this->m_segList = pMVar3;
      pMVar3->m_next = pMVar4;
      uVar7 = (uVar5 & 0xfffffffffffffff0) - chunkSize;
      if (uVar7 < 0x20) {
        return (MemChunk *)psVar1;
      }
      chunk = (SmallMemChunk *)((long)psVar1 + chunkSize);
      pMVar3[1].m_size = chunkSize;
      *(size_type *)((long)&pMVar3->m_pad + chunkSize) = chunkSize;
      *(ulong *)((long)&pMVar3[1].m_size + chunkSize) = uVar7;
      *(ulong *)((long)&pMVar3->m_pad + (uVar5 & 0xfffffffffffffff0)) = uVar7;
      if (0xff < uVar7) {
        addLargeChunk(this,(MemChunk *)chunk);
        return (MemChunk *)psVar1;
      }
      uVar6 = (uint)(uVar7 >> 3) & 0x1e;
      pSVar8 = this->m_smallLists[uVar6].m_head;
      if (pSVar8 == (SmallMemChunk *)0x0) {
        pCVar10 = this->m_smallLists + uVar6;
        pSVar8 = chunk;
        pSVar9 = chunk;
      }
      else {
        pSVar9 = pSVar8->next;
        pSVar8->next = chunk;
        pCVar10 = (CircularList<cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
                   *)&pSVar9->prev;
      }
      pCVar10->m_head = chunk;
      chunk->next = pSVar9;
      chunk->prev = pSVar8;
      if ((this->m_smallMap >> uVar6 & 1) != 0) {
        return (MemChunk *)psVar1;
      }
      this->m_smallMap = this->m_smallMap | 1 << (sbyte)uVar6;
      return (MemChunk *)psVar1;
    }
  }
  return (MemChunk *)0x0;
}

Assistant:

MemChunk*
    arenaAlloc (size_type chunkSize)
    {
        size_type estSize;             /* allocation size */

        estSize = chunkSize + SEGMENT_OVERHEAD;
        if (estSize <= chunkSize)
        {
            // Technically can never reach here due to the MAX_REQUEST value
            //
            // However it is always good to have a check.
            return nullptr;
        }

        /*
         * Check user specified foot print limit
         */
        if (m_footprintLimit != 0)
        {
            size_type fp = m_footprint + estSize;
            if (fp <= m_footprint || fp > m_footprintLimit)
            {
                return nullptr;
            }
        }

        /*
         * Request memory segments from arena.
         */
        size_type segSize = estSize;
        MemSegment* seg = (MemSegment*)m_arena.getSegment (segSize);
        m_logger.logGetSegment (seg, segSize);

        /*
         * Initialize the segment obtained.
         */
        if (seg)
        {

            if ((m_footprint += segSize) > m_maxFootprint)
            {
                m_maxFootprint = m_footprint;
            }

            MemChunk* chunk = seg->init (segSize);

            if (m_segList == nullptr)
            {
                m_segList = seg;
                seg->setNext (nullptr);

                m_release_checks = MAX_RELEASE_CHECK_RATE;
            }
            else
            {
                seg->setNext (m_segList);
                m_segList = seg;
            }

            return splitChunk (chunk, chunkSize);
        }
        return nullptr;
    }